

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

MaterialList * rw::MaterialList::streamRead(Stream *stream,MaterialList *matlist)

{
  FILE *__stream;
  bool bVar1;
  uint uVar2;
  Error in_RAX;
  Material **ppMVar3;
  void *data;
  long lVar4;
  Material *mat;
  ulong uVar5;
  char *pcVar6;
  ulong uVar7;
  Error _e;
  
  _e = in_RAX;
  bVar1 = findChunk(stream,1,(uint32 *)0x0,(uint32 *)0x0);
  if (bVar1) {
    matlist->materials = (Material **)0x0;
    matlist->numMaterials = 0;
    matlist->space = 0;
    uVar2 = Stream::readI32(stream);
    if (uVar2 == 0) {
      return matlist;
    }
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 778"
    ;
    ppMVar3 = (Material **)(*Engine::memfuncs)((long)(int)uVar2 << 3,0x30007);
    matlist->materials = ppMVar3;
    uVar5 = 0;
    if (ppMVar3 != (Material **)0x0) {
      matlist->space = uVar2;
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 783"
      ;
      data = (void *)(*Engine::memfuncs)((long)(int)(uVar2 * 4),0x10007);
      Stream::read32(stream,data,uVar2 * 4);
      uVar7 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar7 = uVar5;
      }
      do {
        if (uVar7 == uVar5) {
          (*DAT_00144da0)(data);
          return matlist;
        }
        lVar4 = (long)*(int *)((long)data + uVar5 * 4);
        if (lVar4 < 0) {
          bVar1 = findChunk(stream,7,(uint32 *)0x0,(uint32 *)0x0);
          if (!bVar1) {
            _e.plugin = 7;
            _e.code = 0x80000004;
            fprintf(_stderr,"%s:%d: ",
                    "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp"
                    ,0x319);
            pcVar6 = "MATERIAL";
            goto LAB_00107c7a;
          }
          mat = Material::streamRead(stream);
          if (mat == (Material *)0x0) goto LAB_00107ca2;
        }
        else {
          mat = matlist->materials[lVar4];
          mat->refCount = mat->refCount + 1;
        }
        appendMaterial(matlist,mat);
        Material::destroy(mat);
        uVar5 = uVar5 + 1;
      } while( true );
    }
    data = (void *)0x0;
  }
  else {
    _e.plugin = 7;
    _e.code = 0x80000004;
    data = (void *)0x0;
    fprintf(_stderr,"%s:%d: ",
            "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp",0x303);
    pcVar6 = "STRUCT";
LAB_00107c7a:
    __stream = _stderr;
    pcVar6 = dbgsprint(0x80000004,pcVar6);
    fprintf(__stream,"%s\n",pcVar6);
    setError(&_e);
  }
LAB_00107ca2:
  (*DAT_00144da0)(data);
  deinit(matlist);
  return (MaterialList *)0x0;
}

Assistant:

MaterialList*
MaterialList::streamRead(Stream *stream, MaterialList *matlist)
{
	int32 *indices = nil;
	int32 numMat;
	if(!findChunk(stream, ID_STRUCT, nil, nil)){
		RWERROR((ERR_CHUNK, "STRUCT"));
		goto fail;
	}
	matlist->init();
	numMat = stream->readI32();
	if(numMat == 0)
		return matlist;
	matlist->materials = rwMallocT(Material*,numMat, MEMDUR_EVENT | ID_MATERIAL);
	if(matlist->materials == nil)
		goto fail;
	matlist->space = numMat;

	indices = (int32*)rwMalloc(numMat*4, MEMDUR_FUNCTION | ID_MATERIAL);
	stream->read32(indices, numMat*4);

	Material *m;
	for(int32 i = 0; i < numMat; i++){
		if(indices[i] >= 0){
			m = matlist->materials[indices[i]];
			m->addRef();
		}else{
			if(!findChunk(stream, ID_MATERIAL, nil, nil)){
				RWERROR((ERR_CHUNK, "MATERIAL"));
				goto fail;
			}
			m = Material::streamRead(stream);
			if(m == nil)
				goto fail;
		}
		matlist->appendMaterial(m);
		m->destroy();
	}
	rwFree(indices);
	return matlist;
fail:
	rwFree(indices);
	matlist->deinit();
	return nil;
}